

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_cx_iface.c
# Opt level: O3

aom_codec_err_t encoder_destroy(aom_codec_alg_priv_t_conflict *ctx)

{
  char *pcVar1;
  AV1_PRIMARY *ppi;
  void *__ptr;
  FIRSTPASS_STATS *memblk;
  int i;
  long lVar2;
  
  free(ctx->cx_data);
  pcVar1 = (ctx->extra_cfg).two_pass_output;
  if (pcVar1 != (char *)0x0) {
    aom_free(pcVar1);
    (ctx->extra_cfg).two_pass_output = (char *)0x0;
  }
  pcVar1 = (ctx->extra_cfg).second_pass_log;
  if (pcVar1 != (char *)0x0) {
    aom_free(pcVar1);
    (ctx->extra_cfg).second_pass_log = (char *)0x0;
  }
  pcVar1 = (ctx->extra_cfg).partition_info_path;
  if (pcVar1 != ".") {
    aom_free(pcVar1);
    (ctx->extra_cfg).partition_info_path = (char *)0x0;
  }
  pcVar1 = (ctx->extra_cfg).rate_distribution_info;
  if (pcVar1 != "./rate_map.txt") {
    aom_free(pcVar1);
    (ctx->extra_cfg).rate_distribution_info = (char *)0x0;
  }
  pcVar1 = (ctx->extra_cfg).film_grain_table_filename;
  if (pcVar1 != (char *)0x0) {
    aom_free(pcVar1);
    (ctx->extra_cfg).film_grain_table_filename = (char *)0x0;
  }
  ppi = ctx->ppi;
  if (ppi != (AV1_PRIMARY *)0x0) {
    lVar2 = 0x20;
    do {
      __ptr = *(void **)((long)ppi->parallel_cpi + lVar2);
      if (__ptr != (void *)0x0) {
        free(__ptr);
      }
      lVar2 = lVar2 + 0x48;
    } while (lVar2 != 0xf8);
    lVar2 = 0;
    do {
      av1_destroy_context_and_bufferpool(ppi->parallel_cpi[lVar2],&ctx->buffer_pool);
      lVar2 = lVar2 + 1;
    } while (lVar2 != 4);
    ppi->cpi = (AV1_COMP *)0x0;
    if (ppi->cpi_lap != (AV1_COMP *)0x0) {
      av1_destroy_context_and_bufferpool(ppi->cpi_lap,&ctx->buffer_pool_lap);
    }
    av1_remove_primary_compressor(ppi);
  }
  memblk = ctx->frame_stats_buffer;
  aom_free((ctx->stats_buf_context).total_left_stats);
  aom_free((ctx->stats_buf_context).total_stats);
  aom_free(memblk);
  aom_free(ctx);
  return AOM_CODEC_OK;
}

Assistant:

static aom_codec_err_t encoder_destroy(aom_codec_alg_priv_t *ctx) {
  free(ctx->cx_data);
  destroy_extra_config(&ctx->extra_cfg);

  if (ctx->ppi) {
    AV1_PRIMARY *ppi = ctx->ppi;
    for (int i = 0; i < MAX_PARALLEL_FRAMES - 1; i++) {
      if (ppi->parallel_frames_data[i].cx_data) {
        free(ppi->parallel_frames_data[i].cx_data);
      }
    }
#if CONFIG_ENTROPY_STATS
    print_entropy_stats(ppi);
#endif
#if CONFIG_INTERNAL_STATS
    print_internal_stats(ppi);
#endif

    for (int i = 0; i < MAX_PARALLEL_FRAMES; i++) {
      av1_destroy_context_and_bufferpool(ppi->parallel_cpi[i],
                                         &ctx->buffer_pool);
    }
    ppi->cpi = NULL;

    if (ppi->cpi_lap) {
      av1_destroy_context_and_bufferpool(ppi->cpi_lap, &ctx->buffer_pool_lap);
    }
    av1_remove_primary_compressor(ppi);
  }
  destroy_stats_buffer(&ctx->stats_buf_context, ctx->frame_stats_buffer);
  aom_free(ctx);
  return AOM_CODEC_OK;
}